

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomprops.c
# Opt level: O1

int fixAtomName(char *atomname,char *resname,int position)

{
  char cVar1;
  byte bVar2;
  __int32_t **pp_Var3;
  char *pcVar4;
  ulong uVar5;
  char name [5];
  char resn [6];
  byte local_2c [6];
  char local_26 [6];
  
  local_2c[4] = 0;
  local_2c[0] = 0x20;
  local_2c[1] = 0x20;
  local_2c[2] = 0x20;
  local_2c[3] = 0x20;
  uVar5 = 0;
  sprintf(local_26,":%-3.3s:",resname);
  do {
    cVar1 = atomname[uVar5];
    if ((long)cVar1 == 0) goto LAB_0012001f;
    pp_Var3 = __ctype_toupper_loc();
    local_2c[uVar5] = *(byte *)(*pp_Var3 + cVar1);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 4);
  uVar5 = 4;
LAB_0012001f:
  local_2c[uVar5 & 0xffffffff] = 0;
  bVar2 = local_2c[position];
  if (bVar2 < 0x47) {
    if (bVar2 == 0x45) {
      pcVar4 = strstr("currently there are none RMI 070711",local_26);
      if (pcVar4 != (char *)0x0) {
        return 1;
      }
    }
    else if (bVar2 != 0x46) {
      return 0;
    }
    pcVar4 = strstr(":PHF:HF3:HF5:",local_26);
    if (pcVar4 != (char *)0x0) {
      return 1;
    }
LAB_00120097:
    pcVar4 = strstr(": HG:HG2:HGB:HGC:HGI:MAC:MBO:MMC:PHG:PMB:AAS:AMS:BE7:CMH:EMC:EMT:",local_26);
    if (pcVar4 != (char *)0x0) {
      return 1;
    }
  }
  else {
    if (bVar2 == 0x47) goto LAB_00120097;
    if (bVar2 != 0x4f) {
      if (bVar2 != 0x53) {
        return 0;
      }
      goto LAB_001200d3;
    }
  }
  pcVar4 = strstr(": HO:HO3:",local_26);
  if (pcVar4 != (char *)0x0) {
    return 1;
  }
LAB_001200d3:
  pcVar4 = strstr("currently there are none RMI 070711",local_26);
  if (pcVar4 == (char *)0x0) {
    return 0;
  }
  return 1;
}

Assistant:

int fixAtomName(const char* atomname, char resname[], int position) { /* no bool in C */
   char resn[6];
   char name[5] = "    ";
   int i;
   sprintf(resn, ":%-3.3s:", resname);
   for (i = 0; i < 4; i++) { /* uppercase the input */
      if (atomname[i] == '\0') { break; }
      name[i] = toupper(atomname[i]);
   }
   name[i] = '\0';
        switch(name[position]) {
           case 'E': if (strstr(HE_RESNAMES, resn) != NULL) { return 1; }
           case 'F': if (strstr(HF_RESNAMES, resn) != NULL) { return 1; }
           case 'G': if (strstr(HG_RESNAMES, resn) != NULL) { return 1; }
           case 'O': if (strstr(HO_RESNAMES, resn) != NULL) { return 1; }
           case 'S': if (strstr(HS_RESNAMES, resn) != NULL) { return 1; }
           default: break;
	}
   return 0;
}